

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool bitset_bitset_container_andnot
                (bitset_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  int iVar1;
  bitset_container_t *dst_00;
  array_container_t *paVar2;
  
  dst_00 = bitset_container_create();
  iVar1 = bitset_container_andnot(src_1,src_2,dst_00);
  if (iVar1 < 0x1001) {
    paVar2 = array_container_from_bitset(dst_00);
    *dst = paVar2;
    bitset_container_free(dst_00);
  }
  else {
    *dst = dst_00;
  }
  return 0x1000 < iVar1;
}

Assistant:

bool bitset_bitset_container_andnot(
    const bitset_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    bitset_container_t *ans = bitset_container_create();
    int card = bitset_container_andnot(src_1, src_2, ans);
    if (card <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(ans);
        bitset_container_free(ans);
        return false;  // not bitset
    } else {
        *dst = ans;
        return true;
    }
}